

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvafakebios.c
# Opt level: O1

uint16_t bios_edit_u16(uint8_t *vbios,size_t vbios_length,uint offs,uint16_t new)

{
  ulong uVar1;
  uint16_t uVar2;
  
  uVar1 = (ulong)(offs + 1);
  if (uVar1 < vbios_length) {
    uVar2 = CONCAT11(vbios[uVar1],vbios[offs]);
    vbios[offs] = (uint8_t)new;
    vbios[uVar1] = (uint8_t)(new >> 8);
  }
  else {
    uVar2 = 0;
    fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
  }
  return uVar2;
}

Assistant:

uint16_t bios_edit_u16(uint8_t *vbios, size_t vbios_length, unsigned int offs, uint16_t new) {
	uint16_t orig = 0;
	if (offs+1 >= vbios_length) {
		fprintf(stderr, "requested OOB u16 at 0x%04x\n", offs);
		return 0;
	}
	orig = vbios[offs] | vbios[offs+1] << 8;
	vbios[offs + 0] = (new >> 0) & 0xff;
	vbios[offs + 1] = (new >> 8) & 0xff;
	return orig;
}